

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_insert.cpp
# Opt level: O1

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> __thiscall
duckdb::StructInsertStats(duckdb *this,ClientContext *context,FunctionStatisticsInput *input)

{
  vector<duckdb::BaseStatistics,_true> *this_00;
  reference pvVar1;
  idx_t iVar2;
  BaseStatistics *new_stats_00;
  long lVar3;
  idx_t i;
  LogicalType *other;
  size_type __n;
  BaseStatistics new_stats;
  LogicalType local_a0;
  BaseStatistics local_88;
  
  this_00 = input->child_stats;
  other = &(input->expr->super_Expression).return_type;
  LogicalType::LogicalType(&local_a0,other);
  StructStats::CreateUnknown(&local_88,&local_a0);
  LogicalType::~LogicalType(&local_a0);
  pvVar1 = vector<duckdb::BaseStatistics,_true>::operator[](this_00,0);
  iVar2 = StructType::GetChildCount(&pvVar1->type);
  pvVar1 = vector<duckdb::BaseStatistics,_true>::operator[](this_00,0);
  new_stats_00 = StructStats::GetChildStats(pvVar1);
  if (iVar2 != 0) {
    i = 0;
    do {
      StructStats::SetChildStats(&local_88,i,new_stats_00);
      i = i + 1;
      new_stats_00 = new_stats_00 + 1;
    } while (iVar2 != i);
  }
  iVar2 = StructType::GetChildCount(other);
  lVar3 = (long)(this_00->
                super_vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>).
                super__Vector_base<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this_00->
                super_vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>).
                super__Vector_base<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3;
  if (1 < (ulong)(lVar3 * 0x2e8ba2e8ba2e8ba3)) {
    __n = 1;
    do {
      pvVar1 = vector<duckdb::BaseStatistics,_true>::operator[](this_00,__n);
      StructStats::SetChildStats(&local_88,lVar3 * -0x2e8ba2e8ba2e8ba3 + iVar2 + __n,pvVar1);
      __n = __n + 1;
    } while (__n < (ulong)(((long)(this_00->
                                  super_vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>
                                  ).
                                  super__Vector_base<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this_00->
                                  super_vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>
                                  ).
                                  super__Vector_base<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          0x2e8ba2e8ba2e8ba3));
  }
  BaseStatistics::ToUnique((BaseStatistics *)this);
  BaseStatistics::~BaseStatistics(&local_88);
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)this;
}

Assistant:

unique_ptr<BaseStatistics> StructInsertStats(ClientContext &context, FunctionStatisticsInput &input) {
	auto &child_stats = input.child_stats;
	auto &expr = input.expr;
	auto new_stats = StructStats::CreateUnknown(expr.return_type);

	auto existing_count = StructType::GetChildCount(child_stats[0].GetType());
	auto existing_stats = StructStats::GetChildStats(child_stats[0]);
	for (idx_t i = 0; i < existing_count; i++) {
		StructStats::SetChildStats(new_stats, i, existing_stats[i]);
	}

	auto new_count = StructType::GetChildCount(expr.return_type);
	auto offset = new_count - child_stats.size();
	for (idx_t i = 1; i < child_stats.size(); i++) {
		StructStats::SetChildStats(new_stats, offset + i, child_stats[i]);
	}
	return new_stats.ToUnique();
}